

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.cc
# Opt level: O3

void __thiscall
test_registry_minimal_keeps_alias_persistent_flag::test_method
          (test_registry_minimal_keeps_alias_persistent_flag *this)

{
  RegistryIterator it;
  Registry target;
  Registry registry;
  undefined8 **local_270;
  undefined1 local_268;
  undefined8 *local_260;
  char **local_258;
  shared_count *local_250;
  undefined8 local_248;
  shared_count asStack_240 [2];
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  char *local_218;
  undefined1 local_210 [16];
  char *local_200;
  char *local_1f8;
  Registry local_1f0 [128];
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  Registry local_b0 [128];
  
  Typelib::Registry::Registry(local_b0);
  Typelib::CXX::addStandardTypes(local_b0);
  Typelib::Registry::Registry(local_1f0);
  Typelib::CXX::addStandardTypes(local_1f0);
  local_270 = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/int","");
  local_250 = asStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/Persistent","");
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
  Typelib::Registry::alias
            ((string *)local_1f0,(string *)&local_270,SUB81(&local_250,0),(string *)0x1);
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_250 != asStack_240) {
    operator_delete(local_250);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  local_270 = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/int","");
  local_250 = asStack_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/Temporary","");
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
  Typelib::Registry::alias
            ((string *)local_1f0,(string *)&local_270,SUB81(&local_250,0),(string *)0x0);
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_250 != asStack_240) {
    operator_delete(local_250);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  Typelib::Registry::minimal(local_1f0,SUB81(local_b0,0));
  local_270 = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/Persistent","");
  Typelib::Registry::find((string *)&local_220);
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x10d);
  Typelib::Registry::end();
  local_248 = 0;
  asStack_240[0].pi_ = (sp_counted_base *)0x0;
  local_200 = "it != target.end()";
  local_1f8 = "";
  local_268 = 0;
  local_270 = (undefined8 **)&PTR__lazy_ostream_00184378;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_d8 = "";
  local_258 = &local_200;
  local_250._0_1_ = (string)(local_228 != local_218);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_240);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x10e);
  local_250 = (shared_count *)CONCAT71(local_250._1_7_,local_218[0x48]);
  local_248 = 0;
  asStack_240[0].pi_ = (sp_counted_base *)0x0;
  local_230 = "it.isPersistent()";
  local_228 = "";
  local_268 = 0;
  local_270 = (undefined8 **)&PTR__lazy_ostream_00184378;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_108 = "";
  local_258 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_240);
  local_270 = &local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/Temporary","");
  Typelib::Registry::find((string *)&local_220);
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x112);
  Typelib::Registry::end();
  local_248 = 0;
  asStack_240[0].pi_ = (sp_counted_base *)0x0;
  local_200 = "it != target.end()";
  local_1f8 = "";
  local_268 = 0;
  local_270 = (undefined8 **)&PTR__lazy_ostream_00184378;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_138 = "";
  local_258 = &local_200;
  local_250._0_1_ = (string)(local_228 != local_218);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_240);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x113);
  local_250 = (shared_count *)(CONCAT71(local_250._1_7_,local_218[0x48]) ^ 1);
  local_248 = 0;
  asStack_240[0].pi_ = (sp_counted_base *)0x0;
  local_230 = "!it.isPersistent()";
  local_228 = "";
  local_268 = 0;
  local_270 = (undefined8 **)&PTR__lazy_ostream_00184378;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
  ;
  local_168 = "";
  local_258 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_240);
  Typelib::Registry::~Registry(local_1f0);
  Typelib::Registry::~Registry(local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_registry_minimal_keeps_alias_persistent_flag )
{
    Registry registry;
    Typelib::CXX::addStandardTypes(registry);
    Registry target;
    Typelib::CXX::addStandardTypes(target);
    target.alias("/int", "/Persistent", true);
    target.alias("/int", "/Temporary", false);

    target.minimal(registry);
    { RegistryIterator it = target.find("/Persistent");
        BOOST_REQUIRE(it != target.end());
        BOOST_REQUIRE(it.isPersistent());
    }

    { RegistryIterator it = target.find("/Temporary");
        BOOST_REQUIRE(it != target.end());
        BOOST_REQUIRE(!it.isPersistent());
    }
}